

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O0

RGBResult * __thiscall
AsyncRgbLedAnalyzer::ReadRGBTriple(RGBResult *__return_storage_ptr__,AsyncRgbLedAnalyzer *this)

{
  byte bVar1;
  ColorLayout layout;
  pointer pAVar2;
  RGBValue RVar3;
  undefined1 local_58 [8];
  ReadResult bitResult;
  int i;
  undefined8 local_30;
  U64 value;
  DataBuilder local_20 [4];
  int channel;
  DataBuilder builder;
  U16 channels [3];
  U8 bitSize;
  AsyncRgbLedAnalyzer *this_local;
  
  pAVar2 = std::
           unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
           ::operator->(&this->mSettings);
  bVar1 = AsyncRgbLedAnalyzerSettings::BitSize(pAVar2);
  memset(&builder,0,6);
  RGBResult::RGBResult(__return_storage_ptr__);
  DataBuilder::DataBuilder(local_20);
  value._4_4_ = 0;
  while (value._4_4_ < 3) {
    local_30 = 0;
    DataBuilder::Reset((ulonglong *)local_20,(ShiftOrder)&local_30,0);
    bitResult.mEndSample._0_4_ = 0;
    while (((int)(uint)bitResult.mEndSample < (int)(uint)bVar1 &&
           (ReadBit((ReadResult *)local_58,this), (local_58[0] & 1U) != 0))) {
      if (((uint)bitResult.mEndSample == 0) && (value._4_4_ == 0)) {
        __return_storage_ptr__->mValueBeginSample = bitResult._0_8_;
      }
      __return_storage_ptr__->mValueEndSample = bitResult.mBeginSample;
      DataBuilder::AddBit((BitState)local_20);
      __return_storage_ptr__->mIsReset = (bool)(local_58[1] & 1);
      bitResult.mEndSample._0_4_ = (uint)bitResult.mEndSample + 1;
    }
    if ((uint)bitResult.mEndSample != bVar1) break;
    *(short *)(&builder + (long)value._4_4_ * 2) = (short)local_30;
    value._4_4_ = value._4_4_ + 1;
  }
  if (value._4_4_ == 3) {
    pAVar2 = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::operator->(&this->mSettings);
    layout = AsyncRgbLedAnalyzerSettings::GetColorLayout(pAVar2);
    RVar3 = RGBValue::CreateFromControllerOrder(layout,(U16 *)&builder);
    __return_storage_ptr__->mRGB = RVar3;
    __return_storage_ptr__->mValid = true;
  }
  DataBuilder::~DataBuilder(local_20);
  return __return_storage_ptr__;
}

Assistant:

auto AsyncRgbLedAnalyzer::ReadRGBTriple() -> RGBResult
{
    const U8 bitSize = mSettings->BitSize();
    U16 channels[ 3 ] = { 0, 0, 0 };
    RGBResult result;

    DataBuilder builder;
    int channel = 0;

    for( ; channel < 3; )
    {
        U64 value = 0;
        builder.Reset( &value, AnalyzerEnums::MsbFirst, bitSize );
        int i = 0;

        for( ; i < bitSize; ++i )
        {
            auto bitResult = ReadBit();

            if( !bitResult.mValid )
            {
                break;
            }

            // for the first bit of channel 0, record the beginning time
            // for accurate frame positions in the results
            if( ( i == 0 ) && ( channel == 0 ) )
            {
                result.mValueBeginSample = bitResult.mBeginSample;
            }

            result.mValueEndSample = bitResult.mEndSample;
            builder.AddBit( bitResult.mBitValue );
            result.mIsReset = bitResult.mIsReset;
        }

        if( i == bitSize )
        {
            // we saw a complete channel, save it
            channels[ channel++ ] = value;
        }
        else
        {
            // partial data due to reset or invalid timing, discard
            break;
        }
    }

    if( channel == 3 )
    {
        // we saw three complete channels, we can use this
        result.mRGB = RGBValue::CreateFromControllerOrder( mSettings->GetColorLayout(), channels );
        result.mValid = true;
    } // in all other cases, mValid stays false - no RGB data was written

    return result;
}